

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fadst8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i x6 [8];
  __m256i x5 [8];
  __m256i x4 [8];
  __m256i x3 [8];
  __m256i x2 [8];
  __m256i x1 [8];
  __m256i cospi_p12_m52;
  __m256i cospi_p52_p12;
  __m256i cospi_p28_m36;
  __m256i cospi_p36_p28;
  __m256i cospi_p44_m20;
  __m256i cospi_p20_p44;
  __m256i cospi_p60_m04;
  __m256i cospi_p04_p60;
  __m256i cospi_m48_p16;
  __m256i cospi_p48_m16;
  __m256i cospi_p16_p48;
  __m256i cospi_p32_m32;
  __m256i cospi_p32_p32;
  __m256i __rounding;
  __m256i __zero;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff250;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined4 uStack_bf0;
  int32_t in_stack_fffffffffffff414;
  int32_t cos_bit_00;
  undefined8 in_stack_fffffffffffff418;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffff420;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffff428;
  undefined8 uVar17;
  longlong in_stack_fffffffffffff430;
  longlong lVar18;
  undefined8 uStack_bc8;
  __m256i *in_stack_fffffffffffff448;
  __m256i *in_stack_fffffffffffff450;
  undefined8 in_stack_fffffffffffff458;
  undefined8 in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  longlong in_stack_fffffffffffff470;
  undefined8 in_stack_fffffffffffff478;
  undefined8 in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  longlong in_stack_fffffffffffff490;
  undefined8 local_ac0;
  __m256i *palStack_ab8;
  __m256i *palStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  longlong lStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  longlong lStack_a70;
  undefined8 uStack_a68;
  
  cospi_arr((int)in_DL);
  uVar14 = 1 << (in_DL - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  vpinsrd_avx(auVar1,uVar14,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  vpinsrd_avx(auVar1,uVar14,3);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff250 >> 0x10),
                     (int16_t)in_stack_fffffffffffff250);
  auVar7 = *in_RDI;
  auVar2 = *in_RDI;
  auVar3 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),in_RDI[7]);
  auVar4 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),in_RDI[3]);
  auVar9 = in_RDI[4];
  auVar8 = in_RDI[4];
  auVar5 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),in_RDI[1]);
  auVar13 = in_RDI[6];
  auVar12 = in_RDI[6];
  auVar11 = in_RDI[2];
  auVar10 = in_RDI[2];
  auVar6 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),in_RDI[5]);
  w0[1] = in_stack_fffffffffffff480;
  w0[0] = in_stack_fffffffffffff478;
  w0[2] = in_stack_fffffffffffff488;
  w0[3] = in_stack_fffffffffffff490;
  w1[1] = in_stack_fffffffffffff460;
  w1[0] = in_stack_fffffffffffff458;
  w1[2] = in_stack_fffffffffffff468;
  w1[3] = in_stack_fffffffffffff470;
  _r[1] = in_stack_fffffffffffff420;
  _r[0] = in_stack_fffffffffffff418;
  _r[2] = in_stack_fffffffffffff428;
  _r[3] = in_stack_fffffffffffff430;
  btf_16_w16_avx2(w0,w1,in_stack_fffffffffffff450,in_stack_fffffffffffff448,_r,
                  in_stack_fffffffffffff414);
  w0_00[1] = in_stack_fffffffffffff480;
  w0_00[0] = in_stack_fffffffffffff478;
  w0_00[2] = in_stack_fffffffffffff488;
  w0_00[3] = in_stack_fffffffffffff490;
  w1_00[1] = in_stack_fffffffffffff460;
  w1_00[0] = in_stack_fffffffffffff458;
  w1_00[2] = in_stack_fffffffffffff468;
  w1_00[3] = in_stack_fffffffffffff470;
  _r_00[1] = in_stack_fffffffffffff420;
  _r_00[0] = in_stack_fffffffffffff418;
  _r_00[2] = in_stack_fffffffffffff428;
  _r_00[3] = in_stack_fffffffffffff430;
  btf_16_w16_avx2(w0_00,w1_00,in_stack_fffffffffffff450,in_stack_fffffffffffff448,_r_00,
                  in_stack_fffffffffffff414);
  auVar2 = vpaddsw_avx2(auVar2,auVar4);
  auVar7 = vpsubsw_avx2(auVar7,auVar4);
  auVar4 = vpaddsw_avx2(auVar3,auVar8);
  auVar8 = vpsubsw_avx2(auVar3,auVar9);
  auVar3 = vpaddsw_avx2(auVar5,auVar10);
  auVar9 = vpsubsw_avx2(auVar5,auVar11);
  auVar5 = vpaddsw_avx2(auVar12,auVar6);
  auVar6 = vpsubsw_avx2(auVar13,auVar6);
  local_ac0 = auVar2._0_8_;
  palStack_ab8 = auVar2._8_8_;
  palStack_ab0 = auVar2._16_8_;
  uStack_aa8 = auVar2._24_8_;
  local_aa0 = auVar4._0_8_;
  uStack_a98 = auVar4._8_8_;
  lStack_a90 = auVar4._16_8_;
  uStack_a88 = auVar4._24_8_;
  local_a80 = auVar7._0_8_;
  uStack_a78 = auVar7._8_8_;
  lStack_a70 = auVar7._16_8_;
  uStack_a68 = auVar7._24_8_;
  w0_01[1] = local_a80;
  w0_01[0] = uStack_a88;
  w0_01[2] = uStack_a78;
  w0_01[3] = lStack_a70;
  w1_01[1] = local_aa0;
  w1_01[0] = uStack_aa8;
  w1_01[2] = uStack_a98;
  w1_01[3] = lStack_a90;
  _r_01[1] = in_stack_fffffffffffff420;
  _r_01[0] = in_stack_fffffffffffff418;
  _r_01[2] = in_stack_fffffffffffff428;
  _r_01[3] = in_stack_fffffffffffff430;
  btf_16_w16_avx2(w0_01,w1_01,palStack_ab0,palStack_ab8,_r_01,in_stack_fffffffffffff414);
  w0_02[1] = local_a80;
  w0_02[0] = uStack_a88;
  w0_02[2] = uStack_a78;
  w0_02[3] = lStack_a70;
  w1_02[1] = local_aa0;
  w1_02[0] = uStack_aa8;
  w1_02[2] = uStack_a98;
  w1_02[3] = lStack_a90;
  _r_02[1] = in_stack_fffffffffffff420;
  _r_02[0] = in_stack_fffffffffffff418;
  _r_02[2] = in_stack_fffffffffffff428;
  _r_02[3] = in_stack_fffffffffffff430;
  btf_16_w16_avx2(w0_02,w1_02,palStack_ab0,palStack_ab8,_r_02,in_stack_fffffffffffff414);
  auVar2._8_8_ = palStack_ab8;
  auVar2._0_8_ = local_ac0;
  auVar2._16_8_ = palStack_ab0;
  auVar2._24_8_ = uStack_aa8;
  auVar2 = vpaddsw_avx2(auVar2,auVar3);
  auVar7._8_8_ = palStack_ab8;
  auVar7._0_8_ = local_ac0;
  auVar7._16_8_ = palStack_ab0;
  auVar7._24_8_ = uStack_aa8;
  auVar7 = vpsubsw_avx2(auVar7,auVar3);
  auVar4._8_8_ = uStack_a98;
  auVar4._0_8_ = local_aa0;
  auVar4._16_8_ = lStack_a90;
  auVar4._24_8_ = uStack_a88;
  auVar4 = vpaddsw_avx2(auVar4,auVar5);
  auVar10._8_8_ = uStack_a98;
  auVar10._0_8_ = local_aa0;
  auVar10._16_8_ = lStack_a90;
  auVar10._24_8_ = uStack_a88;
  auVar10 = vpsubsw_avx2(auVar10,auVar5);
  auVar3._8_8_ = uStack_a78;
  auVar3._0_8_ = local_a80;
  auVar3._16_8_ = lStack_a70;
  auVar3._24_8_ = uStack_a68;
  auVar3 = vpaddsw_avx2(auVar3,auVar9);
  auVar5._8_8_ = uStack_a78;
  auVar5._0_8_ = local_a80;
  auVar5._16_8_ = lStack_a70;
  auVar5._24_8_ = uStack_a68;
  auVar5 = vpsubsw_avx2(auVar5,auVar9);
  local_c00 = auVar5._0_8_;
  uStack_bf8 = auVar5._8_8_;
  uStack_bf0 = auVar5._16_4_;
  cos_bit_00 = auVar5._20_4_;
  uVar15 = auVar5._24_8_;
  auVar5 = vpaddsw_avx2(auVar8,auVar6);
  auVar6 = vpsubsw_avx2(auVar8,auVar6);
  uVar16 = auVar6._0_8_;
  uVar17 = auVar6._8_8_;
  lVar18 = auVar6._16_8_;
  uStack_bc8 = auVar6._24_8_;
  w0_03[1] = local_a80;
  w0_03[0] = uStack_a88;
  w0_03[2] = uStack_a78;
  w0_03[3] = lStack_a70;
  w1_03[1] = local_aa0;
  w1_03[0] = uStack_aa8;
  w1_03[2] = uStack_a98;
  w1_03[3] = lStack_a90;
  _r_03[1] = uVar16;
  _r_03[0] = uVar15;
  _r_03[2] = uVar17;
  _r_03[3] = lVar18;
  btf_16_w16_avx2(w0_03,w1_03,palStack_ab0,palStack_ab8,_r_03,cos_bit_00);
  local_cc0 = auVar2._0_8_;
  uStack_cb8 = auVar2._8_8_;
  uStack_cb0 = auVar2._16_8_;
  uStack_ca8 = auVar2._24_8_;
  local_ca0 = auVar4._0_8_;
  uStack_c98 = auVar4._8_8_;
  uStack_c90 = auVar4._16_8_;
  uStack_c88 = auVar4._24_8_;
  w0_04[1] = local_a80;
  w0_04[0] = uStack_a88;
  w0_04[2] = uStack_a78;
  w0_04[3] = lStack_a70;
  w1_04[1] = local_aa0;
  w1_04[0] = uStack_aa8;
  w1_04[2] = uStack_a98;
  w1_04[3] = lStack_a90;
  _r_04[1] = uVar16;
  _r_04[0] = uVar15;
  _r_04[2] = uVar17;
  _r_04[3] = lVar18;
  btf_16_w16_avx2(w0_04,w1_04,palStack_ab0,palStack_ab8,_r_04,cos_bit_00);
  local_c80 = auVar3._0_8_;
  uStack_c78 = auVar3._8_8_;
  uStack_c70 = auVar3._16_8_;
  uStack_c68 = auVar3._24_8_;
  local_c60 = auVar5._0_8_;
  uStack_c58 = auVar5._8_8_;
  uStack_c50 = auVar5._16_8_;
  uStack_c48 = auVar5._24_8_;
  w0_05[1] = local_a80;
  w0_05[0] = uStack_a88;
  w0_05[2] = uStack_a78;
  w0_05[3] = lStack_a70;
  w1_05[1] = local_aa0;
  w1_05[0] = uStack_aa8;
  w1_05[2] = uStack_a98;
  w1_05[3] = lStack_a90;
  _r_05[1] = uVar16;
  _r_05[0] = uVar15;
  _r_05[2] = uVar17;
  _r_05[3] = lVar18;
  btf_16_w16_avx2(w0_05,w1_05,palStack_ab0,palStack_ab8,_r_05,cos_bit_00);
  local_c40 = auVar7._0_8_;
  uStack_c38 = auVar7._8_8_;
  uStack_c30 = auVar7._16_8_;
  uStack_c28 = auVar7._24_8_;
  local_c20 = auVar10._0_8_;
  uStack_c18 = auVar10._8_8_;
  uStack_c10 = auVar10._16_8_;
  uStack_c08 = auVar10._24_8_;
  w0_06[1] = local_a80;
  w0_06[0] = uStack_a88;
  w0_06[2] = uStack_a78;
  w0_06[3] = lStack_a70;
  w1_06[1] = local_aa0;
  w1_06[0] = uStack_aa8;
  w1_06[2] = uStack_a98;
  w1_06[3] = lStack_a90;
  _r_06[1] = uVar16;
  _r_06[0] = uVar15;
  _r_06[2] = uVar17;
  _r_06[3] = lVar18;
  btf_16_w16_avx2(w0_06,w1_06,palStack_ab0,palStack_ab8,_r_06,cos_bit_00);
  *in_RSI = local_ca0;
  in_RSI[1] = uStack_c98;
  in_RSI[2] = uStack_c90;
  in_RSI[3] = uStack_c88;
  in_RSI[4] = local_c00;
  in_RSI[5] = uStack_bf8;
  in_RSI[6] = CONCAT44(cos_bit_00,uStack_bf0);
  in_RSI[7] = uVar15;
  in_RSI[8] = local_c60;
  in_RSI[9] = uStack_c58;
  in_RSI[10] = uStack_c50;
  in_RSI[0xb] = uStack_c48;
  in_RSI[0xc] = local_c40;
  in_RSI[0xd] = uStack_c38;
  in_RSI[0xe] = uStack_c30;
  in_RSI[0xf] = uStack_c28;
  in_RSI[0x10] = local_c20;
  in_RSI[0x11] = uStack_c18;
  in_RSI[0x12] = uStack_c10;
  in_RSI[0x13] = uStack_c08;
  in_RSI[0x14] = local_c80;
  in_RSI[0x15] = uStack_c78;
  in_RSI[0x16] = uStack_c70;
  in_RSI[0x17] = uStack_c68;
  in_RSI[0x18] = uVar16;
  in_RSI[0x19] = uVar17;
  in_RSI[0x1a] = lVar18;
  in_RSI[0x1b] = uStack_bc8;
  in_RSI[0x1c] = local_cc0;
  in_RSI[0x1d] = uStack_cb8;
  in_RSI[0x1e] = uStack_cb0;
  in_RSI[0x1f] = uStack_ca8;
  return;
}

Assistant:

static inline void fadst8x8_new_avx2(const __m256i *input, __m256i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m256i x1[8];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[7]);
  x1[2] = _mm256_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm256_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm256_subs_epi16(__zero, input[5]);

  // stage 2
  __m256i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], __rounding,
                  cos_bit);
  x2[2] = x1[2];
  x2[3] = x1[3];
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], __rounding,
                  cos_bit);
  x2[6] = x1[6];
  x2[7] = x1[7];

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm256_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm256_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm256_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm256_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm256_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm256_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x3[4], &x3[5], __rounding,
                  cos_bit);
  x4[4] = x3[4];
  x4[5] = x3[5];
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x3[6], &x3[7], __rounding,
                  cos_bit);
  x4[6] = x3[6];
  x4[7] = x3[7];

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm256_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm256_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm256_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm256_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm256_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm256_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[3], x4[7]);

  // stage 6
  __m256i x6[8];
  btf_16_w16_avx2(cospi_p04_p60, cospi_p60_m04, &x5[0], &x5[1], __rounding,
                  cos_bit);
  x6[0] = x5[0];
  x6[1] = x5[1];
  btf_16_w16_avx2(cospi_p20_p44, cospi_p44_m20, &x5[2], &x5[3], __rounding,
                  cos_bit);
  x6[2] = x5[2];
  x6[3] = x5[3];
  btf_16_w16_avx2(cospi_p36_p28, cospi_p28_m36, &x5[4], &x5[5], __rounding,
                  cos_bit);
  x6[4] = x5[4];
  x6[5] = x5[5];
  btf_16_w16_avx2(cospi_p52_p12, cospi_p12_m52, &x5[6], &x5[7], __rounding,
                  cos_bit);
  x6[6] = x5[6];
  x6[7] = x5[7];

  // stage 7
  output[0] = x6[1];
  output[1] = x6[6];
  output[2] = x6[3];
  output[3] = x6[4];
  output[4] = x6[5];
  output[5] = x6[2];
  output[6] = x6[7];
  output[7] = x6[0];
}